

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O0

bool __thiscall
ImplicitDepLoader::ProcessDepfileDeps
          (ImplicitDepLoader *this,Edge *edge,
          vector<StringPiece,_std::allocator<StringPiece>_> *depfile_ins,string *err)

{
  char *path;
  State *this_00;
  bool bVar1;
  size_type sVar2;
  pointer pSVar3;
  reference pSVar4;
  Node *this_01;
  reference ppNVar5;
  Node *node;
  uint64_t slash_bits;
  __normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_> local_38
  ;
  iterator i;
  iterator implicit_dep;
  string *err_local;
  vector<StringPiece,_std::allocator<StringPiece>_> *depfile_ins_local;
  Edge *edge_local;
  ImplicitDepLoader *this_local;
  
  sVar2 = std::vector<StringPiece,_std::allocator<StringPiece>_>::size(depfile_ins);
  i._M_current = (StringPiece *)PreallocateSpace(this,edge,(int)sVar2);
  local_38._M_current =
       (StringPiece *)std::vector<StringPiece,_std::allocator<StringPiece>_>::begin(depfile_ins);
  while( true ) {
    slash_bits = (uint64_t)std::vector<StringPiece,_std::allocator<StringPiece>_>::end(depfile_ins);
    bVar1 = __gnu_cxx::operator!=
                      (&local_38,
                       (__normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_>
                        *)&slash_bits);
    if (!bVar1) break;
    pSVar3 = __gnu_cxx::
             __normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_>
             ::operator->(&local_38);
    path = pSVar3->str_;
    pSVar3 = __gnu_cxx::
             __normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_>
             ::operator->(&local_38);
    CanonicalizePath(path,&pSVar3->len_,(uint64_t *)&node);
    this_00 = this->state_;
    pSVar4 = __gnu_cxx::
             __normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_>
             ::operator*(&local_38);
    this_01 = State::GetNode(this_00,*pSVar4,(uint64_t)node);
    ppNVar5 = __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
              operator*((__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> *
                        )&i);
    *ppNVar5 = this_01;
    Node::AddOutEdge(this_01,edge);
    CreatePhonyInEdge(this,this_01);
    __gnu_cxx::
    __normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_>::
    operator++(&local_38);
    __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::operator++
              ((__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> *)&i);
  }
  return true;
}

Assistant:

bool ImplicitDepLoader::ProcessDepfileDeps(
    Edge* edge, std::vector<StringPiece>* depfile_ins, std::string* err) {
  // Preallocate space in edge->inputs_ to be filled in below.
  vector<Node*>::iterator implicit_dep =
      PreallocateSpace(edge, depfile_ins->size());

  // Add all its in-edges.
  for (std::vector<StringPiece>::iterator i = depfile_ins->begin();
       i != depfile_ins->end(); ++i, ++implicit_dep) {
    uint64_t slash_bits;
    CanonicalizePath(const_cast<char*>(i->str_), &i->len_, &slash_bits);
    Node* node = state_->GetNode(*i, slash_bits);
    *implicit_dep = node;
    node->AddOutEdge(edge);
    CreatePhonyInEdge(node);
  }

  return true;
}